

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int mixed_queue_clear(mixed_segment *segment)

{
  mixed_segment *segment_00;
  int iVar1;
  uint32_t local_450;
  mixed_segment_info_flags local_44c;
  uint32_t i_2;
  uint32_t i_1;
  mixed_segment *old;
  undefined1 local_438 [4];
  uint32_t i;
  mixed_segment_info info;
  queue_segment_data *data;
  mixed_segment *segment_local;
  
  info.fields[0x1f]._24_8_ = segment->data;
  memset(local_438,0,0x420);
  for (old._4_4_ = 0; old._4_4_ < *(uint *)(info.fields[0x1f]._24_8_ + 8); old._4_4_ = old._4_4_ + 1
      ) {
    segment_00 = *(mixed_segment **)(*(long *)info.fields[0x1f]._24_8_ + (ulong)old._4_4_ * 8);
    mixed_segment_end(segment_00);
    mixed_segment_info((mixed_segment_info *)local_438,segment_00);
    for (local_44c = 0; local_44c < info.flags; local_44c = local_44c + MIXED_IN) {
      mixed_segment_set_in(0,local_44c,(void *)0x0,segment_00);
    }
    for (local_450 = 0; local_450 < info.min_inputs; local_450 = local_450 + 1) {
      mixed_segment_set_out(0,local_450,(void *)0x0,segment_00);
    }
  }
  iVar1 = vector_clear((vector *)info.fields[0x1f]._24_8_);
  return iVar1;
}

Assistant:

MIXED_EXPORT int mixed_queue_clear(struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};
  
  for(uint32_t i=0; i<data->count; ++i){
    struct mixed_segment *old = data->queue[i];
    mixed_segment_end(old);
    mixed_segment_info(&info, old);
    for(uint32_t i=0; i<info.max_inputs; ++i){
      mixed_segment_set_in(MIXED_BUFFER, i, 0, old);
    }
    for(uint32_t i=0; i<info.outputs; ++i){
      mixed_segment_set_out(MIXED_BUFFER, i, 0, old);
    }
  }
  return vector_clear((struct vector *)data);
}